

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O2

err_t cmdSigRead(cmd_sig_t *sig,size_t *sig_len,char *sig_name)

{
  octet *val_00;
  err_t eVar1;
  bool_t bVar2;
  octet *suffix;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  octet *der;
  size_t sVar6;
  octet *der_00;
  octet *poStack_80;
  size_t count;
  octet *local_70;
  ulong local_68;
  octet *val;
  der_anchor_t Signature [1];
  
  eVar1 = cmdFileSuffixRead((octet *)0x0,&count,sig_name,0);
  if (eVar1 != 0) {
    return eVar1;
  }
  suffix = (octet *)blobCreate(count);
  if (suffix == (octet *)0x0) {
    return 0x6e;
  }
  eVar1 = cmdFileSuffixRead(suffix,&count,sig_name,0);
  if (eVar1 != 0) goto LAB_00106055;
  memRev(suffix,count);
  sVar6 = count;
  memSet(sig,'\0',0x630);
  sVar3 = derTSEQDecStart(Signature,suffix,sVar6,0x30);
  poStack_80 = (octet *)0xffffffffffffffff;
  if (sVar3 == 0xffffffffffffffff) goto LAB_00106040;
  sVar6 = sVar6 - sVar3;
  sVar4 = derDec2(&val,&local_68,suffix + sVar3,sVar6,0x30);
  if ((sVar4 == 0xffffffffffffffff) || (0x5b4 < local_68)) {
LAB_0010603d:
    poStack_80 = (octet *)0xffffffffffffffff;
  }
  else {
    der = suffix + sVar3 + sVar4;
    sVar6 = sVar6 - sVar4;
    local_70 = sig->certs;
    sig->certs_len = local_68;
    memCopy(local_70,val,local_68);
    val_00 = sig->date;
    memSet(val_00,'\0',6);
    sVar3 = derTOCTDec2((octet *)0x0,der,sVar6,4,6);
    if (sVar3 != 0xffffffffffffffff) {
      sVar3 = derTOCTDec2(val_00,der,sVar6,4,6);
      if (sVar3 == 0xffffffffffffffff) goto LAB_0010603d;
      der = der + sVar3;
      sVar6 = sVar6 - sVar3;
    }
    sig->sig_len = 0x22;
    sVar3 = derTOCTDec2((octet *)0x0,der,sVar6,4,0x22);
    if (sVar3 == 0xffffffffffffffff) {
      sig->sig_len = 0x30;
      sVar3 = derTOCTDec2((octet *)0x0,der,sVar6,4,0x30);
      if (sVar3 == 0xffffffffffffffff) {
        sig->sig_len = 0x48;
        sVar3 = derTOCTDec2((octet *)0x0,der,sVar6,4,0x48);
        if (sVar3 == 0xffffffffffffffff) {
          sig->sig_len = 0x60;
          sVar3 = derTOCTDec2((octet *)0x0,der,sVar6,4,0x60);
          if (sVar3 == 0xffffffffffffffff) goto LAB_0010603d;
        }
      }
    }
    sVar6 = derTOCTDec2(sig->sig,der,sVar6,4,sig->sig_len);
    if (sVar6 == 0xffffffffffffffff) goto LAB_0010603d;
    sVar3 = derTSEQDecStop(der + sVar6,Signature);
    if ((((sVar3 == 0xffffffffffffffff) || (bVar2 = memIsValid(sig,0x630), bVar2 == 0)) ||
        (uVar5 = sig->sig_len - 0x22, 0x3e < uVar5)) ||
       ((0x4000004000004001U >> (uVar5 & 0x3f) & 1) == 0)) goto LAB_0010603d;
    uVar5 = sig->certs_len;
    poStack_80 = (octet *)0xffffffffffffffff;
    der_00 = local_70;
    if (uVar5 < 0x5b5) {
      for (; uVar5 != 0; uVar5 = uVar5 - sVar4) {
        sVar4 = btokCVCLen(der_00,uVar5);
        if (sVar4 == 0xffffffffffffffff) goto LAB_0010603d;
        der_00 = der_00 + sVar4;
      }
      bVar2 = memIsZero(val_00,6);
      if (bVar2 == 0) {
        bVar2 = tmDateIsValid2(val_00);
        poStack_80 = (octet *)0xffffffffffffffff;
        if (bVar2 == 0) goto LAB_00106040;
      }
      poStack_80 = der + sVar6 + (sVar3 - (long)suffix);
    }
  }
LAB_00106040:
  eVar1 = 0x1fe;
  if ((poStack_80 == (octet *)count) && (eVar1 = 0, sig_len != (size_t *)0x0)) {
    *sig_len = (size_t)poStack_80;
  }
LAB_00106055:
  blobClose(suffix);
  return eVar1;
}

Assistant:

err_t cmdSigRead(cmd_sig_t* sig, size_t* sig_len, const char* sig_name)
{
	err_t code;
	size_t count;
	octet* der;
	// pre
	ASSERT(memIsValid(sig, sizeof(cmd_sig_t)));
	ASSERT(memIsNullOrValid(sig_len, O_PER_S));
	ASSERT(strIsValid(sig_name));
	// определить длину суффикса
	code = cmdFileSuffixRead(0, &count, sig_name, 0);
	ERR_CALL_CHECK(code);
	// прочитать суффикс
	code = cmdBlobCreate(der, count);
	ERR_CALL_CHECK(code);
	code = cmdFileSuffixRead(der, &count, sig_name, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(der));
	// декодировать
	memRev(der, count);
	if (cmdSigDec(sig, der, count) != count)
		code = ERR_BAD_SIG;
	else if (sig_len)
		*sig_len = count;
	// завершить
	cmdBlobClose(der);
	return code;
}